

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertTo
          (CESkyCoord *this,CESkyCoordType *output_coord_type,CEDate *date,CEObserver *observer)

{
  int *in_RDX;
  CESkyCoord *in_RDI;
  CESkyCoord *coord;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_fffffffffffffee0;
  CEObserver *in_stack_fffffffffffffee8;
  CEDate *in_stack_fffffffffffffef0;
  CESkyCoord *in_stack_fffffffffffffef8;
  
  this_00 = in_RDI;
  CESkyCoord(in_stack_fffffffffffffee0);
  if (*in_RDX == 0) {
    ConvertToCIRS(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    operator=(this_00,in_RDI);
    ~CESkyCoord(this_00);
  }
  else if (*in_RDX == 1) {
    ConvertToICRS(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    operator=(this_00,in_RDI);
    ~CESkyCoord(this_00);
  }
  else if (*in_RDX == 2) {
    ConvertToGalactic(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8)
    ;
    operator=(this_00,in_RDI);
    ~CESkyCoord(this_00);
  }
  else if (*in_RDX == 3) {
    ConvertToObserved(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8)
    ;
    operator=(this_00,in_RDI);
    ~CESkyCoord(this_00);
  }
  else if (*in_RDX == 4) {
    ConvertToEcliptic(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8)
    ;
    operator=(this_00,in_RDI);
    ~CESkyCoord(this_00);
  }
  return this_00;
}

Assistant:

CESkyCoord CESkyCoord::ConvertTo(const CESkyCoordType&  output_coord_type, 
                                 const CEDate&     date,
                                 const CEObserver& observer)
{
    // Do conversion to CIRS
    CESkyCoord coord;
    if (output_coord_type == CESkyCoordType::CIRS) {
        coord = ConvertToCIRS(date, observer);
    } else if (output_coord_type == CESkyCoordType::ICRS) {
        coord = ConvertToICRS(date, observer);
    } else if (output_coord_type == CESkyCoordType::GALACTIC) {
        coord = ConvertToGalactic(date, observer);
    } else if (output_coord_type == CESkyCoordType::OBSERVED) {
        coord = ConvertToObserved(date, observer);
    } else if (output_coord_type == CESkyCoordType::ECLIPTIC) {
        coord = ConvertToEcliptic(date, observer);
    }

    return coord;
}